

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_xonly_pubkey(void)

{
  int iVar1;
  int iVar2;
  undefined8 in_R9;
  uchar rand33 [33];
  secp256k1_xonly_pubkey pk_tmp;
  int ecount;
  int i;
  int pk_parity;
  uchar zeros64 [64];
  uchar ones32 [32];
  uchar buf32 [32];
  uchar xy_sk [32];
  uchar sk [32];
  secp256k1_fe y;
  secp256k1_ge pk2;
  secp256k1_ge pk1;
  secp256k1_xonly_pubkey xonly_pk_tmp;
  secp256k1_xonly_pubkey xonly_pk;
  secp256k1_pubkey pk;
  undefined1 in_stack_fffffffffffffd38;
  undefined1 uVar3;
  undefined7 in_stack_fffffffffffffd39;
  secp256k1_context *in_stack_fffffffffffffd40;
  secp256k1_fe *in_stack_fffffffffffffd58;
  secp256k1_fe *in_stack_fffffffffffffd60;
  secp256k1_pubkey *in_stack_fffffffffffffd78;
  secp256k1_ge *in_stack_fffffffffffffd80;
  secp256k1_context *in_stack_fffffffffffffd88;
  secp256k1_pubkey *in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  int iVar4;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  secp256k1_context *in_stack_fffffffffffffda8;
  uchar *in_stack_fffffffffffffdb8;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffdc0;
  secp256k1_context *in_stack_fffffffffffffdc8;
  undefined1 local_218 [32];
  undefined1 local_1f8 [64];
  undefined1 local_1b8 [32];
  secp256k1_fe local_198 [2];
  secp256k1_fe asStack_148 [3];
  undefined1 local_c0 [64];
  undefined1 local_80 [64];
  undefined1 local_40 [64];
  
  memset(&stack0xfffffffffffffda8,0,0x40);
  set_counting_callbacks
            (in_stack_fffffffffffffd40,
             (int *)CONCAT71(in_stack_fffffffffffffd39,in_stack_fffffffffffffd38));
  secp256k1_testrand256((uchar *)in_stack_fffffffffffffd40);
  memset(local_218,0xff,0x20);
  secp256k1_testrand256((uchar *)in_stack_fffffffffffffd40);
  iVar1 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffffdc8,(secp256k1_pubkey *)in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x26,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffda8,
                     (secp256k1_xonly_pubkey *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (int *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     in_stack_fffffffffffffd90);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x27,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
           );
    abort();
  }
  iVar4 = 0;
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffda8,
                     (secp256k1_xonly_pubkey *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (int *)(ulong)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x2b,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffda8,
                     (secp256k1_xonly_pubkey *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (int *)CONCAT44(iVar4,in_stack_fffffffffffffd98),in_stack_fffffffffffffd90);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x2c,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, NULL, &pk_parity, &pk) == 0"
           );
    abort();
  }
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x2d,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffda8,
                     (secp256k1_xonly_pubkey *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (int *)CONCAT44(1,in_stack_fffffffffffffd98),in_stack_fffffffffffffd90);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x2e,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffda8,
                     (secp256k1_xonly_pubkey *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (int *)CONCAT44(iVar4,in_stack_fffffffffffffd98),in_stack_fffffffffffffd90);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x2f,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, NULL) == 0"
           );
    abort();
  }
  if (iVar4 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x30,"test condition failed: ecount == 2");
    abort();
  }
  memset(local_40,0,0x40);
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffda8,
                     (secp256k1_xonly_pubkey *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (int *)CONCAT44(iVar4,in_stack_fffffffffffffd98),in_stack_fffffffffffffd90);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x32,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 0"
           );
    abort();
  }
  if (iVar4 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x33,"test condition failed: ecount == 3");
    abort();
  }
  memset(local_1b8,0,0x20);
  local_1b8[0] = 1;
  iVar1 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffffdc8,(secp256k1_pubkey *)in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x38,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffda8,
                     (secp256k1_xonly_pubkey *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (int *)CONCAT44(iVar4,in_stack_fffffffffffffd98),in_stack_fffffffffffffd90);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x39,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_40,local_80,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x3a,"test condition failed: secp256k1_memcmp_var(&pk, &xonly_pk, sizeof(pk)) == 0");
    abort();
  }
  if (in_stack_fffffffffffffda4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x3b,"test condition failed: pk_parity == 0");
    abort();
  }
  local_1b8[0] = 2;
  iVar1 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffffdc8,(secp256k1_pubkey *)in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x40,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffda8,
                     (secp256k1_xonly_pubkey *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (int *)CONCAT44(iVar4,in_stack_fffffffffffffd98),in_stack_fffffffffffffd90);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x41,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_80,local_40,0x40);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x42,
            "test condition failed: secp256k1_memcmp_var(&xonly_pk, &pk, sizeof(xonly_pk)) != 0");
    abort();
  }
  if (in_stack_fffffffffffffda4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x43,"test condition failed: pk_parity == 1");
    abort();
  }
  secp256k1_pubkey_load
            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  secp256k1_pubkey_load
            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x46,"test condition failed: secp256k1_fe_equal(&pk1.x, &pk2.x) == 1");
    abort();
  }
  secp256k1_fe_impl_negate_unchecked(local_198,asStack_148,1);
  iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x48,"test condition failed: secp256k1_fe_equal(&pk1.y, &y) == 1");
    abort();
  }
  iVar4 = 0;
  iVar1 = secp256k1_xonly_pubkey_serialize
                    ((secp256k1_context *)(ulong)in_stack_fffffffffffffd98,
                     in_stack_fffffffffffffd90->data,
                     (secp256k1_xonly_pubkey *)in_stack_fffffffffffffd88);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x4c,
            "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, NULL, &xonly_pk) == 0");
    abort();
  }
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x4d,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_serialize
                    ((secp256k1_context *)CONCAT44(1,in_stack_fffffffffffffd98),
                     in_stack_fffffffffffffd90->data,
                     (secp256k1_xonly_pubkey *)in_stack_fffffffffffffd88);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x4e,"test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, NULL) == 0");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_1f8,&stack0xfffffffffffffda8,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x4f,"test condition failed: secp256k1_memcmp_var(buf32, zeros64, 32) == 0");
    abort();
  }
  if (iVar4 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x50,"test condition failed: ecount == 2");
    abort();
  }
  memset(&stack0xfffffffffffffd5c,0,0x40);
  iVar1 = secp256k1_xonly_pubkey_serialize
                    ((secp256k1_context *)CONCAT44(iVar4,in_stack_fffffffffffffd98),
                     in_stack_fffffffffffffd90->data,
                     (secp256k1_xonly_pubkey *)in_stack_fffffffffffffd88);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x56,
            "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &pk_tmp) == 0");
    abort();
  }
  if (iVar4 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x59,"test condition failed: ecount == 3");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_serialize
                    ((secp256k1_context *)CONCAT44(3,in_stack_fffffffffffffd98),
                     in_stack_fffffffffffffd90->data,
                     (secp256k1_xonly_pubkey *)in_stack_fffffffffffffd88);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x5b,
            "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1");
    abort();
  }
  iVar4 = 0;
  iVar1 = secp256k1_xonly_pubkey_parse
                    (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x5d,"test condition failed: secp256k1_xonly_pubkey_parse(CTX, NULL, buf32) == 0");
    abort();
  }
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x5e,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_parse
                    (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x5f,"test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, NULL) == 0");
    abort();
  }
  if (iVar4 == 2) {
    iVar1 = secp256k1_xonly_pubkey_from_pubkey
                      (in_stack_fffffffffffffda8,
                       (secp256k1_xonly_pubkey *)
                       CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       (int *)CONCAT44(2,in_stack_fffffffffffffd98),in_stack_fffffffffffffd90);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
              ,99,
              "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1"
             );
      abort();
    }
    iVar1 = secp256k1_xonly_pubkey_serialize
                      ((secp256k1_context *)CONCAT44(iVar4,in_stack_fffffffffffffd98),
                       in_stack_fffffffffffffd90->data,
                       (secp256k1_xonly_pubkey *)in_stack_fffffffffffffd88);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
              ,100,
              "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1")
      ;
      abort();
    }
    iVar1 = secp256k1_xonly_pubkey_parse
                      (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8
                      );
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
              ,0x65,
              "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk_tmp, buf32) == 1")
      ;
      abort();
    }
    iVar1 = secp256k1_memcmp_var(local_80,local_c0,0x40);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
              ,0x66,
              "test condition failed: secp256k1_memcmp_var(&xonly_pk, &xonly_pk_tmp, sizeof(xonly_pk)) == 0"
             );
      abort();
    }
    memset(local_80,1,0x40);
    iVar1 = secp256k1_xonly_pubkey_parse
                      (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8
                      );
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
              ,0x6b,
              "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, ones32) == 0");
      abort();
    }
    iVar1 = secp256k1_memcmp_var(local_80,&stack0xfffffffffffffda8,0x40);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
              ,0x6c,
              "test condition failed: secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0"
             );
      abort();
    }
    memset(local_80,1,0x40);
    iVar1 = secp256k1_xonly_pubkey_parse
                      (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8
                      );
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
              ,0x6f,
              "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, zeros64) == 0");
      abort();
    }
    iVar1 = secp256k1_memcmp_var(local_80,&stack0xfffffffffffffda8,0x40);
    if (iVar1 == 0) {
      iVar1 = 0;
      do {
        if (COUNT <= iVar1) {
          if (iVar4 == 2) {
            return;
          }
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
                  ,0x80,"test condition failed: ecount == 2");
          abort();
        }
        secp256k1_testrand256((uchar *)in_stack_fffffffffffffd40);
        uVar3 = 2;
        iVar2 = secp256k1_ec_pubkey_parse
                          (in_stack_fffffffffffffda8,
                           (secp256k1_pubkey *)CONCAT44(in_stack_fffffffffffffda4,iVar1),
                           (uchar *)CONCAT44(iVar4,in_stack_fffffffffffffd98),
                           (size_t)in_stack_fffffffffffffd90);
        if (iVar2 == 0) {
          memset(local_80,1,0x40);
          iVar2 = secp256k1_xonly_pubkey_parse
                            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                             in_stack_fffffffffffffdb8);
          if (iVar2 != 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
                    ,0x7a,
                    "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 0"
                    ,in_R9,uVar3);
            abort();
          }
          iVar2 = secp256k1_memcmp_var(local_80,&stack0xfffffffffffffda8,0x40);
          if (iVar2 != 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
                    ,0x7b,
                    "test condition failed: secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0"
                    ,in_R9,uVar3);
            abort();
          }
        }
        else {
          iVar2 = secp256k1_xonly_pubkey_parse
                            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                             in_stack_fffffffffffffdb8);
          if (iVar2 != 1) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
                    ,0x7d,
                    "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 1"
                    ,in_R9,uVar3);
            abort();
          }
        }
        iVar1 = iVar1 + 1;
      } while( true );
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x70,
            "test condition failed: secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0"
           );
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
          ,0x60,"test condition failed: ecount == 2");
  abort();
}

Assistant:

static void test_xonly_pubkey(void) {
    secp256k1_pubkey pk;
    secp256k1_xonly_pubkey xonly_pk, xonly_pk_tmp;
    secp256k1_ge pk1;
    secp256k1_ge pk2;
    secp256k1_fe y;
    unsigned char sk[32];
    unsigned char xy_sk[32];
    unsigned char buf32[32];
    unsigned char ones32[32];
    unsigned char zeros64[64] = { 0 };
    int pk_parity;
    int i;

    int ecount;

    set_counting_callbacks(CTX, &ecount);

    secp256k1_testrand256(sk);
    memset(ones32, 0xFF, 32);
    secp256k1_testrand256(xy_sk);
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);

    /* Test xonly_pubkey_from_pubkey */
    ecount = 0;
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, NULL, &pk_parity, &pk) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, NULL) == 0);
    CHECK(ecount == 2);
    memset(&pk, 0, sizeof(pk));
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 0);
    CHECK(ecount == 3);

    /* Choose a secret key such that the resulting pubkey and xonly_pubkey match. */
    memset(sk, 0, sizeof(sk));
    sk[0] = 1;
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK(secp256k1_memcmp_var(&pk, &xonly_pk, sizeof(pk)) == 0);
    CHECK(pk_parity == 0);

    /* Choose a secret key such that pubkey and xonly_pubkey are each others
     * negation. */
    sk[0] = 2;
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK(secp256k1_memcmp_var(&xonly_pk, &pk, sizeof(xonly_pk)) != 0);
    CHECK(pk_parity == 1);
    secp256k1_pubkey_load(CTX, &pk1, &pk);
    secp256k1_pubkey_load(CTX, &pk2, (secp256k1_pubkey *) &xonly_pk);
    CHECK(secp256k1_fe_equal(&pk1.x, &pk2.x) == 1);
    secp256k1_fe_negate(&y, &pk2.y, 1);
    CHECK(secp256k1_fe_equal(&pk1.y, &y) == 1);

    /* Test xonly_pubkey_serialize and xonly_pubkey_parse */
    ecount = 0;
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, NULL, &xonly_pk) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, NULL) == 0);
    CHECK(secp256k1_memcmp_var(buf32, zeros64, 32) == 0);
    CHECK(ecount == 2);
    {
        /* A pubkey filled with 0s will fail to serialize due to pubkey_load
         * special casing. */
        secp256k1_xonly_pubkey pk_tmp;
        memset(&pk_tmp, 0, sizeof(pk_tmp));
        CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &pk_tmp) == 0);
    }
    /* pubkey_load called illegal callback */
    CHECK(ecount == 3);

    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1);
    ecount = 0;
    CHECK(secp256k1_xonly_pubkey_parse(CTX, NULL, buf32) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, NULL) == 0);
    CHECK(ecount == 2);

    /* Serialization and parse roundtrip */
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1);
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk_tmp, buf32) == 1);
    CHECK(secp256k1_memcmp_var(&xonly_pk, &xonly_pk_tmp, sizeof(xonly_pk)) == 0);

    /* Test parsing invalid field elements */
    memset(&xonly_pk, 1, sizeof(xonly_pk));
    /* Overflowing field element */
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, ones32) == 0);
    CHECK(secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0);
    memset(&xonly_pk, 1, sizeof(xonly_pk));
    /* There's no point with x-coordinate 0 on secp256k1 */
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, zeros64) == 0);
    CHECK(secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0);
    /* If a random 32-byte string can not be parsed with ec_pubkey_parse
     * (because interpreted as X coordinate it does not correspond to a point on
     * the curve) then xonly_pubkey_parse should fail as well. */
    for (i = 0; i < COUNT; i++) {
        unsigned char rand33[33];
        secp256k1_testrand256(&rand33[1]);
        rand33[0] = SECP256K1_TAG_PUBKEY_EVEN;
        if (!secp256k1_ec_pubkey_parse(CTX, &pk, rand33, 33)) {
            memset(&xonly_pk, 1, sizeof(xonly_pk));
            CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 0);
            CHECK(secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0);
        } else {
            CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 1);
        }
    }
    CHECK(ecount == 2);
}